

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uoffset64_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::ReferTo
          (FlatBufferBuilderImpl<false> *this,uoffset64_t off)

{
  ulong uVar1;
  
  if (this->minalign_ < 8) {
    this->minalign_ = 8;
  }
  vector_downward<unsigned_int>::fill(&this->buf_,(ulong)(-(this->buf_).size_ & 7));
  uVar1 = (ulong)(this->buf_).size_;
  if (off - 1 < uVar1) {
    return (uVar1 - off) + 8;
  }
  __assert_fail("off && off <= size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x180,
                "T flatbuffers::FlatBufferBuilderImpl<>::ReferTo(const T, const T2) [Is64Aware = false, T = unsigned long, T2 = unsigned int]"
               );
}

Assistant:

uoffset64_t ReferTo(uoffset64_t off) {
    // Align to ensure GetSize() below is correct.
    Align(sizeof(uoffset64_t));
    // 64-bit offsets are relative to tail of the whole buffer
    return ReferTo(off, GetSize());
  }